

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eviction.cpp
# Opt level: O2

void ProtectEvictionCandidatesByRatio
               (vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                *eviction_candidates)

{
  long *plVar1;
  pointer pNVar2;
  pointer pNVar3;
  __normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
  __last;
  function<bool_(const_NodeEvictionCandidate_&)> __pred;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  __normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
  _Var9;
  undefined7 uVar10;
  ulong uVar11;
  difference_type __n;
  long lVar12;
  ulong uVar13;
  difference_type __n_1;
  ulong uVar14;
  pointer pNVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  byte bVar17;
  bool bVar18;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  function<bool_(const_NodeEvictionCandidate_&)> local_98;
  array<Net,_4UL> networks;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = (eviction_candidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pNVar3 = (eviction_candidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  uVar4 = ((long)pNVar3 - (long)pNVar2) / 0x48;
  networks._M_elems[0].count = 0;
  networks._M_elems[1].count = 0;
  networks._M_elems[2].count = 0;
  networks._M_elems[3].count = 0;
  networks._M_elems[0].is_local = false;
  networks._M_elems[0]._1_3_ = 0;
  networks._M_elems[0].id = NET_CJDNS;
  networks._M_elems[1].is_local = false;
  networks._M_elems[1]._1_3_ = 0;
  networks._M_elems[1].id = NET_I2P;
  networks._M_elems[2].is_local = true;
  networks._M_elems[2]._1_3_ = 0;
  networks._M_elems[2].id = NET_MAX;
  networks._M_elems[3].is_local = false;
  networks._M_elems[3]._1_3_ = 0;
  networks._M_elems[3].id = NET_ONION;
  for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 0x10) {
    lVar12 = 0;
    for (pNVar15 = pNVar2; pNVar15 != pNVar3; pNVar15 = pNVar15 + 1) {
      if ((&networks._M_elems[0].is_local)[lVar5] == true) {
        bVar17 = pNVar15->m_is_local;
      }
      else {
        bVar17 = pNVar15->m_network == *(Network *)((long)&networks._M_elems[0].id + lVar5);
      }
      lVar12 = lVar12 + (ulong)bVar17;
    }
    *(long *)((long)&networks._M_elems[0].count + lVar5) = lVar12;
  }
  uVar6 = uVar4 >> 1;
  uVar8 = 2;
  while (uVar8 != 0) {
    uVar16 = uVar8 << 4;
    pvVar7 = operator_new(uVar16,(nothrow_t *)&std::nothrow);
    if (pvVar7 != (void *)0x0) {
      std::
      __stable_sort_adaptive<ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>&)::Net*,ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>&)::Net*,long,__gnu_cxx::__ops::_Iter_comp_iter<ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>&)::__3>>
                (&networks,&local_38,pvVar7,uVar8);
      goto LAB_00773fc5;
    }
    bVar18 = uVar8 == 1;
    uVar8 = uVar8 + 1 >> 1;
    if (bVar18) {
      uVar8 = 0;
    }
  }
  std::
  __insertion_sort<ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>&)::Net*,__gnu_cxx::__ops::_Iter_comp_iter<ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>&)::__3>>
            (&networks,&local_38);
  pvVar7 = (void *)0x0;
  uVar16 = 0;
LAB_00773fc5:
  operator_delete(pvVar7,uVar16);
  uVar8 = uVar4 >> 2;
  uVar16 = 0;
LAB_00773fe8:
  do {
    uVar11 = uVar8 - uVar16;
    if (uVar8 < uVar16 || uVar11 == 0) break;
    uVar14 = 0;
    for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 0x10) {
      uVar14 = (uVar14 + 1) - (ulong)(*(long *)((long)&networks._M_elems[0].count + lVar5) == 0);
    }
    if (uVar14 == 0) break;
    lVar5 = 0;
    uVar13 = uVar11 / uVar14;
    if (uVar11 < uVar14) {
      uVar13 = 1;
    }
    bVar17 = 0;
    uVar10 = 0;
    for (; lVar5 != 0x40; lVar5 = lVar5 + 0x10) {
      if (*(long *)((long)&networks._M_elems[0].count + lVar5) != 0) {
        _Var9._M_current =
             (eviction_candidates->
             super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
             _M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             (eviction_candidates->
             super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        uVar14 = ((long)__last._M_current - (long)_Var9._M_current) / 0x48;
        local_b8._M_unused._0_8_ = (undefined8)(&networks._M_elems[0].is_local + lVar5);
        local_b8._8_8_ = 0;
        local_a0 = std::
                   _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:152:53)>
                   ::_M_invoke;
        local_a8 = std::
                   _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:152:53)>
                   ::_M_manager;
        std::
        __sort<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,__gnu_cxx::__ops::_Iter_comp_iter<CompareNodeNetworkTime>>
                  (_Var9,__last,
                   (_Iter_comp_iter<CompareNodeNetworkTime>)
                   ((ulong)*(uint *)((long)&networks._M_elems[0].id + lVar5) << 0x20 |
                   (ulong)(byte)*local_b8._M_unused._M_function_pointer));
        pNVar2 = (eviction_candidates->
                 super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        _Var9._M_current =
             (eviction_candidates->
             super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        std::function<bool_(const_NodeEvictionCandidate_&)>::function
                  (&local_98,(function<bool_(const_NodeEvictionCandidate_&)> *)&local_b8);
        uVar11 = ((long)_Var9._M_current - (long)pNVar2) / 0x48;
        if (uVar13 <= uVar11) {
          uVar11 = uVar13;
        }
        __pred.super__Function_base._M_functor._8_8_ = uVar4;
        __pred.super__Function_base._M_functor._M_unused._M_object = (void *)uVar16;
        __pred.super__Function_base._M_manager = (_Manager_type)uVar8;
        __pred._M_invoker._0_1_ = bVar17;
        __pred._M_invoker._1_7_ = uVar10;
        _Var9 = std::
                remove_if<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,std::function<bool(NodeEvictionCandidate_const&)>>
                          (_Var9._M_current + -uVar11,_Var9,__pred);
        std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::erase
                  (eviction_candidates,(const_iterator)_Var9._M_current,
                   (eviction_candidates->
                   super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                   )._M_impl.super__Vector_impl_data._M_finish);
        std::_Function_base::~_Function_base(&local_98.super__Function_base);
        std::_Function_base::~_Function_base((_Function_base *)&local_b8);
        uVar11 = ((long)(eviction_candidates->
                        super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(eviction_candidates->
                       super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x48;
        lVar12 = uVar14 - uVar11;
        if (uVar11 <= uVar14 && lVar12 != 0) {
          uVar16 = uVar16 + lVar12;
          if (uVar8 <= uVar16) goto LAB_00773fe8;
          plVar1 = (long *)((long)&networks._M_elems[0].count + lVar5);
          *plVar1 = *plVar1 - lVar12;
          uVar10 = (undefined7)(uVar16 >> 8);
          bVar17 = 1;
        }
      }
    }
  } while ((bVar17 & 1) != 0);
  if (uVar16 != ((long)(eviction_candidates->
                       super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(eviction_candidates->
                      super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                      )._M_impl.super__Vector_impl_data._M_start) / -0x48 + uVar4) {
    __assert_fail("num_protected == initial_size - eviction_candidates.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp"
                  ,0xad,
                  "void ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate> &)");
  }
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_manager;
  EraseLastKElements<NodeEvictionCandidate,bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>
            (eviction_candidates,ReverseCompareNodeTimeConnected,uVar6 - uVar16,
             (function<bool_(const_NodeEvictionCandidate_&)> *)&local_d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate>& eviction_candidates)
{
    // Protect the half of the remaining nodes which have been connected the longest.
    // This replicates the non-eviction implicit behavior, and precludes attacks that start later.
    // To favorise the diversity of our peer connections, reserve up to half of these protected
    // spots for Tor/onion, localhost, I2P, and CJDNS peers, even if they're not longest uptime
    // overall. This helps protect these higher-latency peers that tend to be otherwise
    // disadvantaged under our eviction criteria.
    const size_t initial_size = eviction_candidates.size();
    const size_t total_protect_size{initial_size / 2};

    // Disadvantaged networks to protect. In the case of equal counts, earlier array members
    // have the first opportunity to recover unused slots from the previous iteration.
    struct Net { bool is_local; Network id; size_t count; };
    std::array<Net, 4> networks{
        {{false, NET_CJDNS, 0}, {false, NET_I2P, 0}, {/*localhost=*/true, NET_MAX, 0}, {false, NET_ONION, 0}}};

    // Count and store the number of eviction candidates per network.
    for (Net& n : networks) {
        n.count = std::count_if(eviction_candidates.cbegin(), eviction_candidates.cend(),
                                [&n](const NodeEvictionCandidate& c) {
                                    return n.is_local ? c.m_is_local : c.m_network == n.id;
                                });
    }
    // Sort `networks` by ascending candidate count, to give networks having fewer candidates
    // the first opportunity to recover unused protected slots from the previous iteration.
    std::stable_sort(networks.begin(), networks.end(), [](Net a, Net b) { return a.count < b.count; });

    // Protect up to 25% of the eviction candidates by disadvantaged network.
    const size_t max_protect_by_network{total_protect_size / 2};
    size_t num_protected{0};

    while (num_protected < max_protect_by_network) {
        // Count the number of disadvantaged networks from which we have peers to protect.
        auto num_networks = std::count_if(networks.begin(), networks.end(), [](const Net& n) { return n.count; });
        if (num_networks == 0) {
            break;
        }
        const size_t disadvantaged_to_protect{max_protect_by_network - num_protected};
        const size_t protect_per_network{std::max(disadvantaged_to_protect / num_networks, static_cast<size_t>(1))};
        // Early exit flag if there are no remaining candidates by disadvantaged network.
        bool protected_at_least_one{false};

        for (Net& n : networks) {
            if (n.count == 0) continue;
            const size_t before = eviction_candidates.size();
            EraseLastKElements(eviction_candidates, CompareNodeNetworkTime(n.is_local, n.id),
                               protect_per_network, [&n](const NodeEvictionCandidate& c) {
                                   return n.is_local ? c.m_is_local : c.m_network == n.id;
                               });
            const size_t after = eviction_candidates.size();
            if (before > after) {
                protected_at_least_one = true;
                const size_t delta{before - after};
                num_protected += delta;
                if (num_protected >= max_protect_by_network) {
                    break;
                }
                n.count -= delta;
            }
        }
        if (!protected_at_least_one) {
            break;
        }
    }

    // Calculate how many we removed, and update our total number of peers that
    // we want to protect based on uptime accordingly.
    assert(num_protected == initial_size - eviction_candidates.size());
    const size_t remaining_to_protect{total_protect_size - num_protected};
    EraseLastKElements(eviction_candidates, ReverseCompareNodeTimeConnected, remaining_to_protect);
}